

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

ReservedRange *
google::protobuf::descriptor_unittest::AddReservedRange(DescriptorProto *parent,int start,int end)

{
  DescriptorProto_ReservedRange *this;
  ReservedRange *result;
  int end_local;
  int start_local;
  DescriptorProto *parent_local;
  
  this = DescriptorProto::add_reserved_range(parent);
  DescriptorProto_ReservedRange::set_start(this,start);
  DescriptorProto_ReservedRange::set_end(this,end);
  return this;
}

Assistant:

DescriptorProto::ReservedRange* AddReservedRange(DescriptorProto* parent,
                                                 int start, int end) {
  DescriptorProto::ReservedRange* result = parent->add_reserved_range();
  result->set_start(start);
  result->set_end(end);
  return result;
}